

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PPrintPI(TidyDocImpl *doc,uint indent,Node *node)

{
  TidyPrintImpl *pprint;
  byte bVar1;
  uint uVar2;
  ulong in_RAX;
  uint c_00;
  byte *str;
  undefined4 uStack_38;
  tchar c;
  
  pprint = &doc->pprint;
  _uStack_38 = in_RAX;
  SetWrap(doc,indent);
  AddString(pprint,"<?");
  for (str = (byte *)node->element; str != (byte *)0x0; str = str + 1) {
    bVar1 = *str;
    if (bVar1 == 0) break;
    _uStack_38 = (ulong)CONCAT14(bVar1,uStack_38);
    c_00 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      uVar2 = prvTidyGetUTF8((ctmbstr)str,&c);
      str = str + uVar2;
      c_00 = c;
    }
    AddChar(pprint,c_00);
  }
  PPrintText(doc,0x10,indent,node);
  if (((*(int *)((doc->config).value + 100) != 0) || (*(int *)((doc->config).value + 0x62) != 0)) ||
     (node->closed != no)) {
    AddChar(pprint,0x3f);
  }
  AddChar(pprint,0x3e);
  PCondFlushLine(doc,indent);
  return;
}

Assistant:

static void PPrintPI( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    tchar c;
    tmbstr s;

    SetWrap( doc, indent );
    AddString( pprint, "<?" );

    s = node->element;

    while (s && *s)
    {
        c = (unsigned char)*s;
        if (c > 0x7F)
            s += TY_(GetUTF8)(s, &c);
        AddChar(pprint, c);
        ++s;
    }

    /* set CDATA to pass < and > unescaped */
    PPrintText( doc, CDATA, indent, node );

    if (cfgBool(doc, TidyXmlOut) ||
        cfgBool(doc, TidyXhtmlOut) || node->closed)
        AddChar( pprint, '?' );

    AddChar( pprint, '>' );
    PCondFlushLine( doc, indent );
}